

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pedestrian.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_70a26::Pedestrian::annotatePathFollowing
          (Pedestrian *this,Vec3 *future,Vec3 *onPath,Vec3 *target,float outside)

{
  long *in_RDI;
  Vec3 onPathBoundary;
  Vec3 boundaryOffset;
  Color yellowOrange;
  Color darkOrange;
  Color lightOrange;
  Color yellow;
  Color *in_stack_fffffffffffffeb8;
  float bValue;
  float rValue;
  Color *this_00;
  AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *this_01;
  Vec3 *in_stack_fffffffffffffee0;
  undefined1 local_64 [32];
  Color local_44;
  Color local_34 [3];
  
  this_00 = local_34;
  bValue = 0.0;
  rValue = 1.0;
  OpenSteer::Color::Color(this_00,1.0,1.0,0.0,1.0);
  OpenSteer::Color::Color(&local_44,rValue,0.5,bValue,rValue);
  OpenSteer::Color::Color((Color *)(local_64 + 0x10),0.6,0.3,bValue,rValue);
  this_01 = (AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)local_64;
  OpenSteer::Color::Color((Color *)this_01,rValue,0.75,bValue,rValue);
  (**(code **)(*in_RDI + 0x40))();
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine(this_01,(Vec3 *)this_00,(Vec3 *)CONCAT44(rValue,bValue),in_stack_fffffffffffffeb8);
  (**(code **)(*in_RDI + 0x40))();
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine(this_01,(Vec3 *)this_00,(Vec3 *)CONCAT44(rValue,bValue),in_stack_fffffffffffffeb8);
  OpenSteer::Vec3::operator-((Vec3 *)this_01,(Vec3 *)this_00);
  OpenSteer::Vec3::normalize(in_stack_fffffffffffffee0);
  OpenSteer::Vec3::operator*((Vec3 *)this_01,(float)((ulong)this_00 >> 0x20));
  OpenSteer::Vec3::operator+((Vec3 *)this_01,(Vec3 *)this_00);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine(this_01,(Vec3 *)this_00,(Vec3 *)CONCAT44(rValue,bValue),in_stack_fffffffffffffeb8);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine(this_01,(Vec3 *)this_00,(Vec3 *)CONCAT44(rValue,bValue),in_stack_fffffffffffffeb8);
  return;
}

Assistant:

void annotatePathFollowing (const Vec3& future,
                                    const Vec3& onPath,
                                    const Vec3& target,
                                    const float outside)
        {
            const Color yellow (1, 1, 0);
            const Color lightOrange (1.0f, 0.5f, 0.0f);
            const Color darkOrange  (0.6f, 0.3f, 0.0f);
            const Color yellowOrange (1.0f, 0.75f, 0.0f);

            // draw line from our position to our predicted future position
            annotationLine (position(), future, yellow);

            // draw line from our position to our steering target on the path
            annotationLine (position(), target, yellowOrange);

            // draw a two-toned line between the future test point and its
            // projection onto the path, the change from dark to light color
            // indicates the boundary of the tube.
            const Vec3 boundaryOffset = (onPath - future).normalize() * outside;
            const Vec3 onPathBoundary = future + boundaryOffset;
            annotationLine (onPath, onPathBoundary, darkOrange);
            annotationLine (onPathBoundary, future, lightOrange);
        }